

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# budCovPlatform.cpp
# Opt level: O0

cl_int cov::getPlatformInfo
                 (cl_platform_id platform,cl_platform_info paramName,size_t paramValueSize,
                 void *paramValue,size_t *paramValueSizeRet)

{
  Platform *p;
  size_t *paramValueSizeRet_local;
  void *paramValue_local;
  size_t paramValueSize_local;
  cl_platform_info paramName_local;
  cl_platform_id platform_local;
  
  switch(paramName) {
  case 0x900:
    platform_local._4_4_ =
         utils::getStringParam
                   ((string *)(platform + 0x10),paramValueSize,paramValue,paramValueSizeRet);
    break;
  case 0x901:
    platform_local._4_4_ =
         utils::getStringParam
                   ((string *)(platform + 0x30),paramValueSize,paramValue,paramValueSizeRet);
    break;
  case 0x902:
    platform_local._4_4_ =
         utils::getStringParam
                   ((string *)(platform + 0x50),paramValueSize,paramValue,paramValueSizeRet);
    break;
  case 0x903:
    platform_local._4_4_ =
         utils::getStringParam
                   ((string *)(platform + 0x70),paramValueSize,paramValue,paramValueSizeRet);
    break;
  case 0x904:
    platform_local._4_4_ =
         utils::getStringParam
                   ((string *)(platform + 0x90),paramValueSize,paramValue,paramValueSizeRet);
    break;
  default:
    platform_local._4_4_ = -0x1e;
  }
  return platform_local._4_4_;
}

Assistant:

cl_int getPlatformInfo(cl_platform_id platform,
                       cl_platform_info paramName,
                       size_t paramValueSize,
                       void* paramValue,
                       size_t* paramValueSizeRet)
{
    auto p = reinterpret_cast<Platform*>(platform);
    switch (paramName) {
        case CL_PLATFORM_PROFILE:
            return utils::getStringParam(p->m_profile, paramValueSize, paramValue, paramValueSizeRet);
        case CL_PLATFORM_VERSION:
            return utils::getStringParam(p->m_version, paramValueSize, paramValue, paramValueSizeRet);
        case CL_PLATFORM_NAME:
            return utils::getStringParam(p->m_name, paramValueSize, paramValue, paramValueSizeRet);
        case CL_PLATFORM_VENDOR:
            return utils::getStringParam(p->m_vendor, paramValueSize, paramValue, paramValueSizeRet);
        case CL_PLATFORM_EXTENSIONS:
            return utils::getStringParam(p->m_extensions, paramValueSize, paramValue, paramValueSizeRet);
        default:
            return CL_INVALID_VALUE;
    }
}